

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void tlstran_ep_close(void *arg)

{
  undefined8 local_20;
  tlstran_pipe *p;
  tlstran_ep *ep;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)arg);
  *(undefined1 *)((long)arg + 0x39) = 1;
  nni_aio_close((nni_aio *)((long)arg + 0x248));
  if (*(long *)((long)arg + 0x58) != 0) {
    nng_stream_dialer_close(*(nng_stream_dialer **)((long)arg + 0x58));
  }
  if (*(long *)((long)arg + 0x60) != 0) {
    nng_stream_listener_close(*(nng_stream_listener **)((long)arg + 0x60));
  }
  for (local_20 = nni_list_first((nni_list *)((long)arg + 0x428)); local_20 != (void *)0x0;
      local_20 = nni_list_next((nni_list *)((long)arg + 0x428),local_20)) {
    nni_pipe_close(*(nni_pipe **)((long)local_20 + 8));
  }
  for (local_20 = nni_list_first((nni_list *)((long)arg + 0x410)); local_20 != (void *)0x0;
      local_20 = nni_list_next((nni_list *)((long)arg + 0x410),local_20)) {
    nni_pipe_close(*(nni_pipe **)((long)local_20 + 8));
  }
  if (*(long *)((long)arg + 0x78) != 0) {
    nni_aio_finish_error(*(nni_aio **)((long)arg + 0x78),NNG_ECLOSED);
    *(undefined8 *)((long)arg + 0x78) = 0;
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
tlstran_ep_close(void *arg)
{
	tlstran_ep   *ep = arg;
	tlstran_pipe *p;

	nni_mtx_lock(&ep->mtx);
	ep->closed = true;
	nni_aio_close(&ep->timeaio);

	if (ep->dialer != NULL) {
		nng_stream_dialer_close(ep->dialer);
	}
	if (ep->listener != NULL) {
		nng_stream_listener_close(ep->listener);
	}
	NNI_LIST_FOREACH (&ep->negopipes, p) {
		nni_pipe_close(p->npipe);
	}
	NNI_LIST_FOREACH (&ep->waitpipes, p) {
		nni_pipe_close(p->npipe);
	}
	if (ep->useraio != NULL) {
		nni_aio_finish_error(ep->useraio, NNG_ECLOSED);
		ep->useraio = NULL;
	}
	nni_mtx_unlock(&ep->mtx);
}